

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::ObjectSet(VirtualMachine *this)

{
  element_type *peVar1;
  mapped_type *pmVar2;
  Variable VVar3;
  Variable VVar4;
  Variable VVar5;
  
  VVar3 = popOpStack(this);
  VVar4 = popOpStack(this);
  VVar5 = popOpStack(this);
  if (VVar4.type == String && VVar5.type == Object) {
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)VVar5.field_1.objectValue,(key_type *)VVar4.field_1.objectValue);
    pmVar2->type = VVar3.type;
    (pmVar2->field_1).integerValue = (int64_t)VVar3.field_1;
  }
  pushOpStack(this,(Variable)ZEXT816(0));
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::ObjectSet() {
  Variable third = this->popOpStack();
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (first.type != VariableType::Object) {
    this->pushUndefined();
    this->advance();
    return;
  }

  if (second.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  first.objectValue->properties[*second.stringValue] = third;
  this->pushUndefined();
  this->advance();
}